

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O2

status asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
                 (reactor_op *base)

{
  bool bVar1;
  status sVar2;
  
  bVar1 = socket_ops::non_blocking_recv1
                    (*(socket_type *)&base[1].super_operation.next_,base[1].super_operation.func_,
                     *(size_t *)&base[1].super_operation.task_result_,base[1].ec_._M_value,
                     (bool)((*(byte *)((long)&base[1].super_operation.next_ + 4) & 0x10) >> 4),
                     &base->ec_,&base->bytes_transferred_);
  sVar2 = not_done;
  if (bVar1) {
    if (((ulong)base[1].super_operation.next_ & 0x1000000000) == 0) {
      sVar2 = done;
    }
    else {
      sVar2 = done_and_exhausted;
      if (base->bytes_transferred_ != 0) {
        sVar2 = (uint)bVar1;
      }
    }
  }
  return sVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_recv1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_recv(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }